

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::set_session_paused(torrent *this,bool b)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if (((((uint)uVar1 >> 0x1c & 1) == 0) == b) &&
     (uVar2 = uVar1 & 0xffffffffefffffff | (ulong)((uint)b << 0x1c),
     *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar2,
     ((uVar1 & 0x18000000) != 0) != ((uVar2 & 0x18000000) != 0))) {
    if (b) {
      do_pause(this,false);
      return;
    }
    do_resume(this);
    return;
  }
  return;
}

Assistant:

void torrent::set_session_paused(bool const b)
	{
		if (m_session_paused == b) return;
		bool const paused_before = is_paused();
		m_session_paused = b;

		if (paused_before == is_paused()) return;

		if (b) do_pause();
		else do_resume();
	}